

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLElement * __thiscall tinyxml2::XMLNode::FirstChildElement(XMLNode *this,char *name)

{
  XMLNode *pXVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  char *p;
  XMLNode **ppXVar4;
  XMLElement *this_00;
  
  ppXVar4 = &this->_firstChild;
  do {
    pXVar1 = *ppXVar4;
    if (pXVar1 == (XMLNode *)0x0) {
      return (XMLElement *)0x0;
    }
    iVar3 = (*pXVar1->_vptr_XMLNode[6])(pXVar1);
    this_00 = (XMLElement *)CONCAT44(extraout_var,iVar3);
    if (this_00 != (XMLElement *)0x0) {
      if (name == (char *)0x0) {
        return this_00;
      }
      p = Value((XMLNode *)this_00);
      bVar2 = XMLUtil::StringEqual(p,name,0x7fffffff);
      if (bVar2) {
        return this_00;
      }
    }
    ppXVar4 = &pXVar1->_next;
  } while( true );
}

Assistant:

const XMLElement* XMLNode::FirstChildElement( const char* name ) const
{
    for( const XMLNode* node = _firstChild; node; node = node->_next ) {
        const XMLElement* element = node->ToElement();
        if ( element ) {
            if ( !name || XMLUtil::StringEqual( element->Name(), name ) ) {
                return element;
            }
        }
    }
    return 0;
}